

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O0

int __thiscall Map<String,_int>::remove(Map<String,_int> *this,char *__filename)

{
  Item *this_00;
  Item *pIVar1;
  Item *pIVar2;
  code *pcVar3;
  int iVar4;
  Item *pIVar5;
  Item *pIVar6;
  Item *pIVar7;
  Item **local_a8;
  Item **local_a0;
  usize oldHeight_1;
  usize oldHeight;
  Item *prevLeft;
  Item *prevParent;
  Item *prev;
  Item *nextRight;
  Item *nextParent;
  Item *next;
  Item *right;
  Item *left;
  Item **cell;
  Item *parent;
  Item *origParent;
  Item *item;
  Iterator *it_local;
  Map<String,_int> *this_local;
  
  this_00 = *(Item **)__filename;
  pIVar6 = this_00->parent;
  if (pIVar6 == (Item *)0x0) {
    local_a8 = &this->root;
  }
  else {
    if (this_00 == pIVar6->left) {
      local_a0 = &pIVar6->left;
    }
    else {
      local_a0 = &pIVar6->right;
    }
    local_a8 = local_a0;
  }
  if ((*local_a8 != this_00) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                            ,0xc9,"*cell == item"), iVar4 != 0)) {
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  pIVar7 = this_00->left;
  pIVar5 = this_00->right;
  cell = (Item **)pIVar6;
  if ((pIVar7 == (Item *)0x0) && (pIVar5 == (Item *)0x0)) {
    *local_a8 = (Item *)0x0;
  }
  else if (pIVar7 == (Item *)0x0) {
    *local_a8 = pIVar5;
    pIVar5->parent = pIVar6;
  }
  else if (pIVar5 == (Item *)0x0) {
    *local_a8 = pIVar7;
    pIVar7->parent = pIVar6;
  }
  else {
    if (pIVar7->height < pIVar5->height) {
      pIVar1 = this_00->next;
      if ((pIVar1->left != (Item *)0x0) &&
         (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                                ,0xe4,"!next->left"), iVar4 != 0)) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      cell = (Item **)pIVar1->parent;
      if ((Item *)cell == this_00) {
        if ((pIVar1 != pIVar5) &&
           (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                                  ,0xe8,"next == right"), iVar4 != 0)) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *local_a8 = pIVar1;
        pIVar1->parent = pIVar6;
        pIVar1->left = pIVar7;
        pIVar7->parent = pIVar1;
        cell = (Item **)pIVar1;
      }
      else {
        if ((pIVar1 != ((Item *)cell)->left) &&
           (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                                  ,0xf3,"next == nextParent->left"), iVar4 != 0)) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        pIVar2 = pIVar1->right;
        ((Item *)cell)->left = pIVar2;
        if (pIVar2 != (Item *)0x0) {
          pIVar2->parent = (Item *)cell;
        }
        *local_a8 = pIVar1;
        pIVar1->parent = pIVar6;
        pIVar1->left = pIVar7;
        pIVar7->parent = pIVar1;
        pIVar1->right = pIVar5;
        pIVar5->parent = pIVar1;
        if (((Item *)cell == (Item *)0x0) &&
           (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                                  ,0x107,"parent"), iVar4 != 0)) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
      }
    }
    else {
      pIVar1 = this_00->prev;
      if ((pIVar1->right != (Item *)0x0) &&
         (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                                ,0x10d,"!prev->right"), iVar4 != 0)) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      cell = (Item **)pIVar1->parent;
      if ((Item *)cell == this_00) {
        if ((pIVar1 != pIVar7) &&
           (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                                  ,0x111,"prev == left"), iVar4 != 0)) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *local_a8 = pIVar1;
        pIVar1->parent = pIVar6;
        pIVar1->right = pIVar5;
        pIVar5->parent = pIVar1;
        cell = (Item **)pIVar1;
      }
      else {
        if ((pIVar1 != ((Item *)cell)->right) &&
           (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                                  ,0x11c,"prev == prevParent->right"), iVar4 != 0)) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        pIVar2 = pIVar1->left;
        ((Item *)cell)->right = pIVar2;
        if (pIVar2 != (Item *)0x0) {
          pIVar2->parent = (Item *)cell;
        }
        *local_a8 = pIVar1;
        pIVar1->parent = pIVar6;
        pIVar1->right = pIVar5;
        pIVar5->parent = pIVar1;
        pIVar1->left = pIVar7;
        pIVar7->parent = pIVar1;
        if (((Item *)cell == (Item *)0x0) &&
           (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                                  ,0x130,"parent"), iVar4 != 0)) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
      }
    }
    do {
      pIVar7 = cell[9];
      Item::updateHeightAndSlope((Item *)cell);
      pIVar5 = rebal(this,(Item *)cell);
      if (pIVar7 == (Item *)pIVar5->height) {
        pIVar6 = *local_a8;
        Item::updateHeightAndSlope(pIVar6);
        pIVar6 = rebal(this,pIVar6);
        cell = (Item **)pIVar6->parent;
        break;
      }
      cell = (Item **)pIVar5->parent;
    } while ((Item *)cell != pIVar6);
  }
  do {
    if (cell == (Item **)0x0) {
LAB_001069ac:
      if (this_00->prev == (Item *)0x0) {
        pIVar6 = this_00->next;
        (this->_begin).item = pIVar6;
        pIVar6->prev = (Item *)0x0;
      }
      else {
        pIVar6 = this_00->prev;
        pIVar7 = this_00->next;
        this_00->prev->next = pIVar7;
        pIVar7->prev = pIVar6;
      }
      this->_size = this->_size - 1;
      Item::~Item(this_00);
      this_00->prev = this->freeItem;
      this->freeItem = this_00;
      Iterator::Iterator((Iterator *)&this_local,this_00->next);
      return (int)this_local;
    }
    pIVar6 = cell[9];
    Item::updateHeightAndSlope((Item *)cell);
    pIVar7 = rebal(this,(Item *)cell);
    if (pIVar6 == (Item *)pIVar7->height) goto LAB_001069ac;
    cell = (Item **)pIVar7->parent;
  } while( true );
}

Assistant:

Iterator remove(const Iterator& it)
  {
    Item* item = it.item;
    Item* origParent;
    Item* parent = origParent = item->parent;
    Item** cell = parent ? (item == parent->left ? &parent->left : &parent->right) : &root;
    ASSERT(*cell == item);
    Item* left = item->left;
    Item* right = item->right;

    if(!left && !right)
    {
      *cell = 0;
      goto rebalParentUpwards;
    }

    if(!left)
    {
      *cell = right;
      right->parent = parent;
      goto rebalParentUpwards;
    }

    if(!right)
    {
      *cell = left;
      left->parent = parent;
      goto rebalParentUpwards;
    }

    if(left->height < right->height)
    {
      Item* next = item->next;
      ASSERT(!next->left);
      Item* nextParent = next->parent;
      if(nextParent == item)
      {
        ASSERT(next == right);
        *cell = next;
        next->parent = parent;

        next->left = left;
        left->parent = next;
        parent = next;
        goto rebalParent;
      }

      // unlink next
      ASSERT(next == nextParent->left);
      Item* nextRight = next->right;
      nextParent->left = nextRight;
      if(nextRight)
        nextRight->parent = nextParent;
      
      // put next in cell
      *cell = next;
      next->parent = parent;

      // link left to next left
      next->left = left;
      left->parent = next;

      // link right to next right
      next->right = right;
      right->parent = next;

      // rebal old next->parent
      parent = nextParent;
      ASSERT(parent);
      goto rebalParent;
    }
    else
    {
      Item* prev = item->prev;
      ASSERT(!prev->right);
      Item* prevParent = prev->parent;
      if(prevParent == item)
      {
        ASSERT(prev == left);
        *cell = prev;
        prev->parent = parent;

        prev->right = right;
        right->parent = prev;
        parent = prev;
        goto rebalParent;
      }

      // unlink prev
      ASSERT(prev == prevParent->right);
      Item* prevLeft = prev->left;
      prevParent->right = prevLeft;
      if(prevLeft)
        prevLeft->parent = prevParent;

      // put prev in cell
      *cell = prev;
      prev->parent = parent;

      // link right to prev right
      prev->right = right;
      right->parent = prev;

      // link left to prev left
      prev->left = left;
      left->parent = prev;

      // rebal old prev->parent
      parent = prevParent;
      ASSERT(parent);
      goto rebalParent;
    }

    // rebal parent upwards
  rebalParent:
    do
    {
      usize oldHeight = parent->height;
      parent->updateHeightAndSlope();
      parent = rebal(parent);
      if(oldHeight == parent->height)
      {
        parent = *cell;
        parent->updateHeightAndSlope();
        parent = rebal(parent);
        parent = parent->parent;
        break;
      }
      parent = parent->parent;
    } while(parent != origParent);
  rebalParentUpwards:
    while(parent)
    {
      usize oldHeight = parent->height;
      parent->updateHeightAndSlope();
      parent = rebal(parent);
      if(oldHeight == parent->height)
        break;
      parent = parent->parent;
    }

    if(!item->prev)
      (_begin.item = item->next)->prev = 0;
    else
      (item->prev->next = item->next)->prev = item->prev;
    --_size;

    item->~Item();
    item->prev = freeItem;
    freeItem = item;
    return item->next;
  }